

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O0

void __thiscall
Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::AuxPtrs
          (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *this,uint8 capacity,
          AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *ptr)

{
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *local_28;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *ptr_local;
  uint8 capacity_local;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *this_local;
  
  local_28 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)this->ptrs;
  do {
    Memory::WriteBarrierPtr<void>::WriteBarrierPtr((WriteBarrierPtr<void> *)local_28);
    local_28 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
               (local_28->offsets + 6);
  } while (local_28 != this + 1);
  Memory::
  ArrayWriteBarrierVerifyBits<Memory::WriteBarrierPtr<void>[1],Memory::WriteBarrierPtr<void>[1],Memory::Recycler>
            (&this->ptrs,(ulong)ptr->count);
  memcpy(this,ptr,(ulong)ptr->count * 8 + 0x20);
  Memory::
  ArrayWriteBarrier<Memory::WriteBarrierPtr<void>[1],Memory::WriteBarrierPtr<void>[1],Memory::Recycler>
            (&this->ptrs,(ulong)ptr->count);
  this->capacity = capacity;
  return;
}

Assistant:

AuxPtrs<T, FieldsEnum>::AuxPtrs(uint8 capacity, AuxPtrs* ptr)
    {
        ArrayWriteBarrierVerifyBits(&this->ptrs, ptr->count);
        memcpy(this, ptr, offsetof(AuxPtrs, ptrs) + ptr->count * sizeof(void*));
        ArrayWriteBarrier(&this->ptrs, ptr->count);
        this->capacity = capacity;
    }